

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.hpp
# Opt level: O3

void __thiscall
boost::runtime::option::
option<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::description_t,boost::unit_test::basic_cstring<char_const>const&>>
          (option *this,cstring name,
          named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>
          *m)

{
  bool bVar1;
  ref_type pbVar2;
  _Alloc_hider local_118;
  size_type local_110;
  char local_108;
  undefined7 uStack_107;
  undefined8 uStack_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f8;
  string *local_f0;
  cstring local_e8;
  function1<void,_boost::unit_test::basic_cstring<const_char>_> local_d0;
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined1 local_a0;
  undefined8 local_9f;
  undefined4 local_97;
  undefined2 local_93;
  char local_91;
  cstring local_90;
  cstring local_80;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined8 local_5f;
  undefined4 local_57;
  undefined2 local_53;
  char local_51;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined8 local_3f;
  undefined4 local_37;
  undefined2 local_33;
  char local_31;
  
  pbVar2 = m->m_value;
  bVar1 = m->m_erased;
  (this->super_basic_param)._vptr_basic_param = (_func_int **)&PTR__basic_param_001c9fb0;
  local_f0 = &(this->super_basic_param).p_name;
  (this->super_basic_param).p_name._M_dataplus._M_p =
       (pointer)&(this->super_basic_param).p_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>();
  local_110 = 0;
  local_108 = '\0';
  local_118._M_p = &local_108;
  if (bVar1 != true) {
    std::__cxx11::string::_M_replace((ulong)&local_118,0,(char *)0x0,(ulong)pbVar2->m_begin);
    local_f8 = &(this->super_basic_param).p_description.field_2;
    (this->super_basic_param).p_description._M_dataplus._M_p = (pointer)local_f8;
    if (local_118._M_p == &local_108) {
      local_f8->_M_allocated_capacity = CONCAT71(uStack_107,local_108);
      *(undefined8 *)((long)&(this->super_basic_param).p_description.field_2 + 8) = uStack_100;
    }
    else {
      (this->super_basic_param).p_description._M_dataplus._M_p = local_118._M_p;
      (this->super_basic_param).p_description.field_2._M_allocated_capacity =
           CONCAT71(uStack_107,local_108);
    }
    (this->super_basic_param).p_description._M_string_length = local_110;
    local_110 = 0;
    local_108 = '\0';
    local_b0 = &local_a0;
    (this->super_basic_param).p_help._M_dataplus._M_p =
         (pointer)&(this->super_basic_param).p_help.field_2;
    (this->super_basic_param).p_help.field_2._M_local_buf[0] = '\0';
    *(undefined8 *)((long)&(this->super_basic_param).p_help.field_2 + 1) = local_9f;
    *(undefined4 *)((long)&(this->super_basic_param).p_help.field_2 + 9) = local_97;
    *(undefined2 *)((long)&(this->super_basic_param).p_help.field_2 + 0xd) = local_93;
    (this->super_basic_param).p_help.field_2._M_local_buf[0xf] = local_91;
    (this->super_basic_param).p_help._M_string_length = 0;
    local_a8 = 0;
    local_a0 = 0;
    local_50 = &local_40;
    (this->super_basic_param).p_env_var._M_dataplus._M_p =
         (pointer)&(this->super_basic_param).p_env_var.field_2;
    (this->super_basic_param).p_env_var.field_2._M_local_buf[0] = '\0';
    *(undefined8 *)((long)&(this->super_basic_param).p_env_var.field_2 + 1) = local_3f;
    *(undefined4 *)((long)&(this->super_basic_param).p_env_var.field_2 + 9) = local_37;
    *(undefined2 *)((long)&(this->super_basic_param).p_env_var.field_2 + 0xd) = local_33;
    (this->super_basic_param).p_env_var.field_2._M_local_buf[0xf] = local_31;
    (this->super_basic_param).p_env_var._M_string_length = 0;
    local_48 = 0;
    local_40 = 0;
    local_70 = &local_60;
    (this->super_basic_param).p_value_hint._M_dataplus._M_p =
         (pointer)&(this->super_basic_param).p_value_hint.field_2;
    (this->super_basic_param).p_value_hint.field_2._M_local_buf[0] = '\0';
    *(undefined8 *)((long)&(this->super_basic_param).p_value_hint.field_2 + 1) = local_5f;
    *(undefined4 *)((long)&(this->super_basic_param).p_value_hint.field_2 + 9) = local_57;
    *(undefined2 *)((long)&(this->super_basic_param).p_value_hint.field_2 + 0xd) = local_53;
    (this->super_basic_param).p_value_hint.field_2._M_local_buf[0xf] = local_51;
    (this->super_basic_param).p_value_hint._M_string_length = 0;
    local_68 = 0;
    local_60 = 0;
    (this->super_basic_param).p_optional = true;
    (this->super_basic_param).p_repeatable = false;
    (this->super_basic_param).p_has_optional_value = (class_property<bool>)0x1;
    (this->super_basic_param).p_has_default_value = (class_property<bool>)0x1;
    local_d0.super_function_base.vtable = (vtable_base *)0x0;
    (this->super_basic_param).p_callback.
    super_function1<void,_boost::unit_test::basic_cstring<const_char>_>.super_function_base.vtable =
         (vtable_base *)0x0;
    local_118._M_p = &local_108;
    function1<void,_boost::unit_test::basic_cstring<const_char>_>::move_assign
              (&(this->super_basic_param).p_callback.
                super_function1<void,_boost::unit_test::basic_cstring<const_char>_>,&local_d0);
    function1<void,_boost::unit_test::basic_cstring<const_char>_>::~function1(&local_d0);
    (this->super_basic_param).m_cla_ids.
    super__Vector_base<boost::runtime::parameter_cla_id,_std::allocator<boost::runtime::parameter_cla_id>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this->super_basic_param).m_cla_ids.
    super__Vector_base<boost::runtime::parameter_cla_id,_std::allocator<boost::runtime::parameter_cla_id>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->super_basic_param).m_cla_ids.
    super__Vector_base<boost::runtime::parameter_cla_id,_std::allocator<boost::runtime::parameter_cla_id>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_e8.m_begin = help_prefix;
    local_e8.m_end = DAT_001cdc28;
    local_90.m_begin = ":";
    local_90.m_end = "";
    local_80.m_begin = name.m_begin;
    local_80.m_end = name.m_end;
    basic_param::add_cla_id_impl(&this->super_basic_param,&local_e8,&local_80,&local_90,false,true);
    (this->super_basic_param)._vptr_basic_param = (_func_int **)&PTR__basic_param_001c9f30;
    (this->m_arg_factory).m_optional_value = true;
    (this->m_arg_factory).m_default_value = false;
    return;
  }
  nfp::nil::inst();
  unit_test::ut_detail::throw_exception<boost::nfp::nfp_detail::access_to_invalid_parameter>
            ((access_to_invalid_parameter *)&local_b0);
}

Assistant:

option( cstring name, Modifiers const& m )
#endif
    : basic_param( name, true, false, nfp::opt_append( nfp::opt_append( m, optional_value = true), default_value = false) )
    , m_arg_factory( nfp::opt_append( nfp::opt_append( m, optional_value = true), default_value = false) )
    {
    }